

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_printer.cpp
# Opt level: O3

void printGraphShortestPathViz(Graph *g,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred)

{
  pointer psVar1;
  pointer psVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  ostream *poVar6;
  unsigned_long uVar7;
  type *ptVar8;
  value_type vVar9;
  AdjList *g_2;
  char *pcVar10;
  long lVar11;
  AdjList *g_1;
  bool bVar12;
  EdgeIterator ei;
  EdgeIterator ei_end;
  undefined8 uStack_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 uStack_158;
  undefined7 uStack_157;
  byte bStack_150;
  long *local_148;
  unsigned_long local_140;
  long *local_138;
  unsigned_long local_130;
  long local_128;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_118;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  undefined8 uStack_77;
  long *local_68;
  undefined1 *local_40;
  undefined8 *local_38;
  
  uStack_158 = 0;
  uStack_157 = 0;
  bStack_150 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_15f = 0;
  uStack_78 = 0;
  uStack_77 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_7f = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph D {\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  rankdir=LR\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  size=\"5,3\"\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ratio=\"fill\"\n",0xf)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  edge[style=\"bold\"]\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  node[shape=\"circle\"]\n",0x17);
  psVar1 = (g->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (g->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.first.vEnd.m_value = (long)psVar2 - (long)psVar1 >> 5;
  if (psVar2 == psVar1) {
    vVar9 = 0;
  }
  else {
    ptVar8 = (type *)&(psVar1->super_StoredVertex).m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    local_118.first.vCurr.m_value = 0;
    do {
      if (*ptVar8 != (type)((_Vector_impl_data *)(ptVar8 + -1))->_M_start) {
        local_118.first.edges.super_type.m_initialized = true;
        local_118.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar8 + -1))->_M_start;
        local_118.first.edges.super_type.m_storage.dummy_._8_8_ = local_118.first.vCurr.m_value;
        local_118.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar8;
        local_118.first.edges.super_type.m_storage.dummy_._24_8_ = local_118.first.vCurr.m_value;
        goto LAB_00110b98;
      }
      local_118.first.vCurr.m_value = local_118.first.vCurr.m_value + 1;
      ptVar8 = ptVar8 + 4;
      vVar9 = local_118.first.vEnd.m_value;
    } while (local_118.first.vEnd.m_value != local_118.first.vCurr.m_value);
  }
  local_118.first.edges.super_type.m_initialized = false;
  local_118.first.vCurr.m_value = vVar9;
LAB_00110b98:
  local_118.first.vBegin.m_value = 0;
  local_118.second.vBegin.m_value = 0;
  local_118.second.edges.super_type.m_initialized = false;
  local_38 = &local_88;
  local_118.first.m_g = g;
  local_118.second.vCurr.m_value = local_118.first.vEnd.m_value;
  local_118.second.vEnd.m_value = local_118.first.vEnd.m_value;
  local_118.second.m_g = g;
  local_40 = (undefined1 *)&uStack_168;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_118);
LAB_00110bdb:
  do {
    uVar7 = local_140;
    if (CONCAT71(uStack_15f,local_160) == CONCAT71(uStack_7f,local_80)) {
      if (CONCAT71(uStack_15f,local_160) == CONCAT71(uStack_157,uStack_158)) {
LAB_00110da4:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        return;
      }
      if ((bStack_150 == 0) || (uStack_77._7_1_ == '\0')) goto LAB_00110df1;
      if (local_148 == local_68) goto LAB_00110da4;
    }
    if ((bStack_150 & 1) == 0) {
LAB_00110df1:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    lVar11 = *local_148;
    piVar3 = (int *)local_148[1];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[label=\"",8);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    bVar12 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar11] == uVar7;
    pcVar10 = ", color=\"grey\"";
    if (bVar12) {
      pcVar10 = ", color=\"black\"";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar10,(ulong)bVar12 | 0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (bStack_150 == 0) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_148 = local_148 + 2;
    if (local_148 == local_138) {
      uVar7 = CONCAT71(uStack_15f,local_160);
      lVar11 = uVar7 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_157,uStack_158) - 1U == uVar7) {
          local_160 = uStack_158;
          uStack_15f = uStack_157;
          goto LAB_00110bdb;
        }
        plVar4 = *(long **)(*(long *)(local_128 + 0x18) + -8 + lVar11);
        plVar5 = *(long **)(*(long *)(local_128 + 0x18) + lVar11);
        lVar11 = lVar11 + 0x20;
        uVar7 = uVar7 + 1;
      } while (plVar5 == plVar4);
      local_160 = (undefined1)uVar7;
      uStack_15f = (undefined7)(uVar7 >> 8);
      local_148 = plVar4;
      local_140 = uVar7;
      local_138 = plVar5;
      local_130 = uVar7;
    }
  } while( true );
}

Assistant:

void printGraphShortestPathViz(Graph g, std::vector<unsigned long> pred)
{
    EdgeIterator ei, ei_end;

    std::cout << "digraph D {\n"
                 << "  rankdir=LR\n"
                 << "  size=\"5,3\"\n"
                 << "  ratio=\"fill\"\n"
                 << "  edge[style=\"bold\"]\n" << "  node[shape=\"circle\"]\n";

    Vertex u,v;
    for (tie(ei, ei_end) = edges(g); ei != ei_end; ++ei) {
        Edge e = *ei;
        u = source(e, g);
        v = target(e, g);
        std::cout << "  " << u << " -> " << v << "[label=\"" << get(get(&EdgeProperties::weight, g), e) << "\"";
        if (pred[v] == u) std::cout << ", color=\"black\"";
        else std::cout << ", color=\"grey\"" ;
        std::cout << "]" << std::endl;
    }
    std::cout << "}" << std::endl;
}